

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O2

void __thiscall
r_comp::RepliCondition::RepliCondition(RepliCondition *this,string *name,bool reversed)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  this->reversed = reversed;
  return;
}

Assistant:

RepliCondition::RepliCondition(const std::string &name, bool reversed)
{
    this->name = name;
    this->reversed = reversed;
}